

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

int Aig_ManRegFindBestVar(Aig_ManPre_t *p)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  lVar5 = (long)p->vFreeVars->nSize;
  if (lVar5 < 1) {
    iVar4 = -1;
  }
  else {
    iVar4 = -1;
    lVar7 = 0;
    iVar8 = 1000000000;
    do {
      iVar1 = p->vFreeVars->pArray[lVar7];
      if (((long)iVar1 < 0) || (p->vMatrix->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = p->vMatrix->pArray[iVar1];
      lVar6 = (long)*(int *)((long)pvVar3 + 4);
      if (lVar6 < 1) {
        return iVar1;
      }
      lVar10 = 0;
      iVar9 = 0;
      do {
        iVar2 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar10 * 4);
        if (p->pfPartVars[iVar2] == '\0') {
          iVar9 = iVar9 + p->pfUsedRegs[iVar2] * 3 + 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar6 != lVar10);
      if (iVar9 == 0) {
        return iVar1;
      }
      iVar2 = iVar9;
      if (iVar8 < iVar9) {
        iVar2 = iVar8;
      }
      if (iVar9 < iVar8) {
        iVar4 = iVar1;
      }
      lVar7 = lVar7 + 1;
      iVar8 = iVar2;
    } while (lVar7 != lVar5);
  }
  return iVar4;
}

Assistant:

int Aig_ManRegFindBestVar( Aig_ManPre_t * p )
{
    Vec_Int_t * vSupp;
    int nNewVars, nNewVarsBest = ABC_INFINITY;
    int iVarFree, iVarSupp, iVarBest = -1, i, k;
    // go through the free variables
    Vec_IntForEachEntry( p->vFreeVars, iVarFree, i )
    {
//        if ( p->pfUsedRegs[iVarFree] )
//            continue;
        // get support of this variable
        vSupp = (Vec_Int_t *)Vec_PtrEntry( p->vMatrix, iVarFree );
        // count the number of new vars
        nNewVars = 0;
        Vec_IntForEachEntry( vSupp, iVarSupp, k )
        {
            if ( p->pfPartVars[iVarSupp] )
                continue;
            nNewVars += 1 + 3 * p->pfUsedRegs[iVarSupp];
        }
        // quit if there is no new variables
        if ( nNewVars == 0 )
            return iVarFree;
        // compare the cost of this
        if ( nNewVarsBest > nNewVars )
        {
            nNewVarsBest = nNewVars;
            iVarBest = iVarFree;
        }
    }
    return iVarBest;
}